

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_long,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,unsigned_long value,
               bool negative)

{
  bool bVar1;
  long lVar2;
  uintptr_t uVar3;
  byte *pbVar4;
  char_t buf [64];
  byte abStack_48 [62];
  byte local_a [2];
  
  pbVar4 = local_a + 1;
  uVar3 = -header_mask;
  if ((int)value == 0) {
    uVar3 = header_mask;
  }
  lVar2 = (ulong)((int)value + 1U & 1) - 1;
  do {
    *pbVar4 = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    pbVar4 = pbVar4 + -1;
    lVar2 = lVar2 + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if (abStack_48 <= pbVar4) {
    *pbVar4 = 0x2d;
    bVar1 = strcpy_insitu<char*,unsigned_long>
                      (dest,header,0x10,(char_t *)(pbVar4 + (byte)((byte)value ^ 1)),-lVar2);
    return bVar1;
  }
  __assert_fail("result >= begin",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                ,0x1257,
                "char_t *pugi::impl::(anonymous namespace)::integer_to_string(char_t *, char_t *, U, bool) [U = unsigned long]"
               );
}

Assistant:

PUGI_IMPL_FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}